

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

htab_hash_t proto_hash(MIR_item_t pi,void *arg)

{
  uint uVar1;
  MIR_type_t MVar2;
  MIR_proto_t pMVar3;
  char *__s;
  MIR_var_t *pMVar4;
  uint64_t uVar5;
  size_t sVar6;
  size_t len;
  uint64_t key;
  size_t *psVar7;
  uint32_t i;
  ulong uVar8;
  
  pMVar3 = (pi->u).proto;
  pMVar4 = VARR_MIR_var_taddr(pMVar3->args);
  uVar1 = pMVar3->nres;
  uVar5 = mir_hash_step(0x2a,(ulong)uVar1);
  uVar5 = mir_hash_step(uVar5,(long)pMVar3->vararg_p);
  for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
    uVar5 = mir_hash_step(uVar5,(ulong)pMVar3->res_types[uVar8]);
  }
  psVar7 = &pMVar4->size;
  uVar8 = 0;
  while( true ) {
    sVar6 = VARR_MIR_var_tlength(pMVar3->args);
    if (sVar6 <= uVar8) break;
    MVar2 = ((MIR_var_t *)(psVar7 + -2))->type;
    uVar5 = mir_hash_step(uVar5,(ulong)MVar2);
    __s = (char *)psVar7[-1];
    len = strlen(__s);
    key = mir_hash(__s,len,0x18);
    uVar5 = mir_hash_step(uVar5,key);
    if (0xfffffff9 < MVar2 - MIR_T_UNDEF) {
      uVar5 = mir_hash_step(uVar5,*psVar7);
    }
    uVar8 = uVar8 + 1;
    psVar7 = psVar7 + 3;
  }
  uVar5 = mir_hash_finish(uVar5);
  return (htab_hash_t)uVar5;
}

Assistant:

static htab_hash_t proto_hash (MIR_item_t pi, void *arg MIR_UNUSED) {
  MIR_proto_t p = pi->u.proto;
  MIR_var_t *args = VARR_ADDR (MIR_var_t, p->args);
  uint64_t h = mir_hash_init (42);

  h = mir_hash_step (h, p->nres);
  h = mir_hash_step (h, p->vararg_p);
  for (uint32_t i = 0; i < p->nres; i++) h = mir_hash_step (h, p->res_types[i]);
  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, p->args); i++) {
    h = mir_hash_step (h, args[i].type);
    h = mir_hash_step (h, mir_hash (args[i].name, strlen (args[i].name), 24));
    if (MIR_all_blk_type_p (args[i].type)) h = mir_hash_step (h, args[i].size);
  }
  return (htab_hash_t) mir_hash_finish (h);
}